

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O0

int get_model_rd_flag(AV1_COMP *cpi,MACROBLOCKD *xd,BLOCK_SIZE bsize)

{
  int iVar1;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int large_block;
  AV1_COMMON *cm;
  undefined1 local_25;
  
  local_25 = 0;
  if ((*(int *)(in_RDI + 0x423dc) == 1) && (local_25 = 0, 8 < in_DL)) {
    iVar1 = cyclic_refresh_segment_id_boosted
                      ((uint)((byte)*(undefined2 *)(**(long **)(in_RSI + 0x1eb8) + 0xa7) & 7));
    local_25 = 0;
    if ((iVar1 == 0) && (local_25 = 0, *(int *)(in_RDI + 0x3c1e8) != 0)) {
      local_25 = *(byte *)(in_RDI + 0x42773) ^ 0xff;
    }
  }
  return (int)(local_25 & 1);
}

Assistant:

static inline int get_model_rd_flag(const AV1_COMP *cpi, const MACROBLOCKD *xd,
                                    BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const int large_block = bsize >= BLOCK_32X32;
  // Only enable for low bitdepth to mitigate issue: b/303023614.
  return cpi->oxcf.rc_cfg.mode == AOM_CBR && large_block &&
         !cyclic_refresh_segment_id_boosted(xd->mi[0]->segment_id) &&
         cm->quant_params.base_qindex && !cpi->oxcf.use_highbitdepth;
}